

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_set_message_annotations(MESSAGE_HANDLE message,message_annotations annotations)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x26e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x26e;
    }
    pcVar5 = "NULL message";
    iVar3 = 0x26d;
  }
  else {
    if (annotations == (message_annotations)0x0) {
      if (message->message_annotations == (AMQP_VALUE)0x0) {
        return 0;
      }
      amqpvalue_destroy(message->message_annotations);
      message->message_annotations = (message_annotations)0x0;
      return 0;
    }
    pAVar1 = amqpvalue_clone(annotations);
    if (pAVar1 != (AMQP_VALUE)0x0) {
      if (message->message_annotations != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(message->message_annotations);
      }
      message->message_annotations = pAVar1;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x289;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x289;
    }
    pcVar5 = "Cannot clone message annotations";
    iVar3 = 0x288;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
            ,"message_set_message_annotations",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int message_set_message_annotations(MESSAGE_HANDLE message, message_annotations annotations)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_044: [ If `message` is NULL, `message_set_message_annotations` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        if (annotations == NULL)
        {
            /* Codes_SRS_MESSAGE_01_145: [ If `annotations` is NULL, the previously stored message annotations associated with `message` shall be freed. ]*/
            if (message->message_annotations != NULL)
            {
                annotations_destroy(message->message_annotations);
                message->message_annotations = NULL;
            }

            /* Codes_SRS_MESSAGE_01_043: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            message_annotations new_message_annotations;

            /* Codes_SRS_MESSAGE_01_042: [ `message_set_message_annotations` shall copy the contents of `annotations` as the message annotations for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_045: [ Cloning the message annotations shall be done by calling `annotations_clone`. ]*/
            new_message_annotations = annotations_clone(annotations);
            if (new_message_annotations == NULL)
            {
                /* Codes_SRS_MESSAGE_01_046: [ If `annotations_clone` fails, `message_set_message_annotations` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message annotations");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_144: [ If setting the message annotations fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->message_annotations != NULL)
                {
                    annotations_destroy(message->message_annotations);
                }

                message->message_annotations = new_message_annotations;

                /* Codes_SRS_MESSAGE_01_043: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}